

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O1

void __thiscall ON_SubDQuadNeighborhood::SetPatchStatus(ON_SubDQuadNeighborhood *this,uint fvi0)

{
  byte bVar1;
  ON_SubDFace *this_00;
  ON_2dex OVar2;
  ON_SubDVertex *pOVar3;
  ON_SubDEdge *this_01;
  uint uVar4;
  ON_2dex min_face_grid_dex_00;
  int iVar5;
  bool bVar6;
  bool bVar7;
  uint corner_index_1;
  ON_SubDEdge *pOVar8;
  ulong uVar9;
  undefined *puVar10;
  uint uVar11;
  uchar uVar12;
  ulong uVar13;
  ON_SubDEdge *(*papOVar14) [2];
  uint uVar15;
  long lVar16;
  uint i;
  int iVar17;
  long lVar18;
  double dVar19;
  bool bExtraordinaryCornerVertex [4];
  bool bCenterEdgeIsCrease [4];
  bool bCenterEdgeIsSmooth [4];
  bool bQuadVertexIsSmoothOrCrease [4];
  ON_2dex max_face_grid_dex;
  ON_2dex min_face_grid_dex;
  ON_SubDVertex *quad_vertex [4];
  char acStack_a7 [3];
  bool local_a4;
  char acStack_a3 [7];
  bool local_9c [4];
  char local_98 [7];
  bool local_91;
  undefined8 local_90;
  ON_SubDVertex *local_88;
  ulong local_80;
  ON_SubDEdge *(*local_78) [2];
  ON_2dex local_70;
  ON_2dex local_68;
  ON_SubDFace *(*local_60) [3];
  ON_2dex local_58;
  ON_SubDVertex *local_50;
  ON_SubDVertex *local_48;
  ON_SubDVertex *local_40;
  
  this->m_bIsCubicPatch = false;
  iVar17 = (uint)this->m_current_subdivision_level - (uint)this->m_initial_subdivision_level;
  if (this->m_current_subdivision_level <= this->m_initial_subdivision_level) {
    iVar17 = 0;
  }
  ON_2dex::ON_2dex(&local_68,0,0);
  ON_2dex::ON_2dex(&local_70,3,3);
  this->m_boundary_crease_count = '\0';
  if (this->m_bBoundaryCrease[0] == true) {
    this->m_boundary_crease_count = '\x01';
    local_68.j = local_68.j + 1;
  }
  if (this->m_bBoundaryCrease[1] == true) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    local_70.i = local_70.i + -1;
  }
  if (this->m_bBoundaryCrease[2] == true) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    local_70.j = local_70.j + -1;
  }
  if (this->m_bBoundaryCrease[3] == true) {
    this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
    local_68.i = local_68.i + 1;
  }
  papOVar14 = (ON_SubDEdge *(*) [2])(ulong)(fvi0 + 1 & 3);
  local_90 = (ON_SubDVertex *)(ulong)(fvi0 - 1 & 3);
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  uVar13 = (ulong)fvi0;
  bVar6 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar13]);
  local_88 = (ON_SubDVertex *)uVar13;
  acStack_a7[uVar13 + 0xf] = bVar6;
  bVar7 = true;
  bVar6 = true;
  if (iVar17 == 0) {
    bVar6 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[(long)papOVar14]);
  }
  uVar13 = (ulong)(fvi0 & 3) ^ 2;
  (&stack0x00000008)[(long)(papOVar14 + -10)] = bVar6;
  if (iVar17 == 0) {
    bVar7 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar13]);
  }
  local_80 = uVar13;
  acStack_a7[uVar13 + 0xf] = bVar7;
  uVar13 = (ulong)local_90;
  bVar6 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[(long)local_90]);
  acStack_a7[uVar13 + 0xf] = bVar6;
  pOVar3 = local_88;
  local_9c[0] = false;
  local_9c[1] = false;
  local_9c[2] = false;
  local_9c[3] = false;
  if (acStack_a7[(long)local_88 + 0xf] == '\0') {
    bVar7 = ON_SubDEdge::IsCrease(this->m_center_edges[(long)local_88]);
  }
  else {
    bVar7 = false;
  }
  acStack_a7[(long)pOVar3 + 0xb] = bVar7;
  if (iVar17 == 0) {
    bVar7 = ON_SubDEdge::IsCrease(this->m_center_edges[(long)papOVar14]);
    bExtraordinaryCornerVertex[(long)(papOVar14 + -10)] = bVar7;
    uVar9 = local_80;
    bVar7 = ON_SubDEdge::IsCrease(this->m_center_edges[local_80]);
  }
  else {
    bExtraordinaryCornerVertex[(long)(papOVar14 + -10)] = false;
    bVar7 = false;
    uVar9 = local_80;
  }
  acStack_a7[uVar9 + 0xb] = bVar7;
  if (bVar6) {
    bVar6 = false;
  }
  else {
    bVar6 = ON_SubDEdge::IsCrease(this->m_center_edges[uVar13]);
  }
  local_78 = papOVar14;
  local_80 = CONCAT44(local_80._4_4_,iVar17);
  acStack_a7[uVar13 + 0xb] = bVar6;
  pOVar8 = this->m_center_edges[0];
  bVar6 = true;
  if (pOVar8 != (ON_SubDEdge *)0x0) {
    uVar13 = 0;
    do {
      if (((pOVar8->m_edge_tag == SmoothX) || (acStack_a7[uVar13 + 0xf] == acStack_a7[uVar13 + 0xb])
          ) || (bVar6 = uVar13 < 3, uVar13 == 3)) break;
      pOVar8 = this->m_center_edges[uVar13 + 1];
      uVar13 = uVar13 + 1;
    } while (pOVar8 != (ON_SubDEdge *)0x0);
  }
  this->m_sharp_edge_count = '\0';
  acStack_a3[3] = '\0';
  acStack_a3[4] = '\0';
  acStack_a3[5] = '\0';
  acStack_a3[6] = '\0';
  lVar16 = -8;
  lVar18 = 0;
  do {
    if (this->m_center_edges[lVar18] != (ON_SubDEdge *)0x0) {
      bVar7 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar18]);
      if (bVar7) {
        this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
        builtin_strncpy(acStack_a3 + 3,"\x01\x01\x01\x01",4);
      }
    }
    this_00 = this->m_face_grid[0][lVar16];
    iVar17 = (int)lVar18;
    if (this_00 != (ON_SubDFace *)0x0) {
      bVar7 = ON_SubDEdge::IsSharp((ON_SubDEdge *)this_00);
      if (bVar7) {
        this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
        acStack_a7[lVar18 + 7] = '\x01';
        acStack_a7[(ulong)(iVar17 + 1U & 3) + 7] = '\x01';
        acStack_a7[(ulong)(iVar17 - 1U & 3) + 7] = '\x01';
      }
    }
    if (this->m_center_edges[lVar16 + -8] != (ON_SubDEdge *)0x0) {
      bVar7 = ON_SubDEdge::IsSharp(this->m_center_edges[lVar16 + -8]);
      if (bVar7) {
        this->m_sharp_edge_count = this->m_sharp_edge_count + '\x01';
        acStack_a7[lVar18 + 7] = '\x01';
        acStack_a7[(ulong)(iVar17 + 1U & 3) + 7] = '\x01';
        acStack_a7[(ulong)(iVar17 - 1U & 3) + 7] = '\x01';
      }
    }
    lVar18 = lVar18 + 1;
    lVar16 = lVar16 + 2;
  } while (lVar18 != 4);
  bVar7 = (int)local_80 == 0;
  _local_a4 = 0;
  acStack_a7[(long)local_88 + 3] = '\x01';
  papOVar14 = local_78;
  bVar7 = (bool)(bVar7 | bVar6);
  bCenterEdgeIsCrease[(long)(local_78 + -0xb)] = bVar7;
  acStack_a7[uVar9 + 3] = bVar7;
  acStack_a7[(long)local_90 + 3] = bCenterEdgeIsCrease[(long)(papOVar14 + -0xb)];
  OVar2 = *(ON_2dex *)(this->m_vertex_grid[1] + 1);
  local_58 = OVar2;
  pOVar3 = this->m_vertex_grid[2][1];
  local_50 = pOVar3;
  local_88 = this->m_vertex_grid[2][2];
  local_48 = local_88;
  local_90 = this->m_vertex_grid[1][2];
  local_40 = local_90;
  lVar16 = 3;
  do {
    dVar19 = ON_SubDVertex::VertexSharpness((ON_SubDVertex *)(&local_70)[lVar16]);
    if (0.0 < dVar19) {
      acStack_a7[lVar16 + 4] = '\x01';
      acStack_a7[(ulong)((uint)lVar16 - 2 & 3) + 7] = '\x01';
      acStack_a7[(ulong)((uint)lVar16 & 3) + 7] = '\x01';
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 7);
  uVar11 = 0x56;
  uVar15 = 0x56;
  if (bVar6 == false) {
    local_98[4] = ON_SubDVertex::IsSmoothOrCrease((ON_SubDVertex *)OVar2);
    local_98[5] = ON_SubDVertex::IsSmoothOrCrease(pOVar3);
    local_98[6] = ON_SubDVertex::IsSmoothOrCrease(local_88);
    local_91 = ON_SubDVertex::IsSmoothOrCrease(local_90);
    papOVar14 = this->m_edge_grid;
    local_60 = this->m_face_grid;
    local_88 = (ON_SubDVertex *)CONCAT44(local_88._4_4_,0x56);
    uVar13 = 0;
    local_78 = papOVar14;
    local_90 = (ON_SubDVertex *)CONCAT44(local_90._4_4_,0x56);
    do {
      if (acStack_a7[uVar13 + 3] != '\0') {
        OVar2 = (&local_58)[uVar13];
        bVar6 = ON_SubDVertex::IsDart((ON_SubDVertex *)OVar2);
        if (!bVar6) {
          iVar17 = (int)uVar13;
          uVar11 = iVar17 + 1U & 3;
          if (acStack_a7[(ulong)uVar11 + 0x13] != '\0') {
            uVar15 = iVar17 - 1U & 3;
            uVar9 = (ulong)uVar15;
            if (acStack_a7[uVar9 + 0x13] != '\0') {
              if ((acStack_a7[uVar13 + 0xf] == '\x01') && (acStack_a7[uVar9 + 0xf] == '\x01')) {
                bVar6 = IsOrdinarySmoothQuadCornerVertex((ON_SubDVertex *)OVar2);
                if (bVar6) {
LAB_00625245:
                  acStack_a7[uVar13 + 3] = '\0';
                }
              }
              else if ((acStack_a7[uVar13 + 0xb] == '\x01') && (acStack_a7[uVar9 + 0xf] == '\x01'))
              {
                bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)OVar2);
                if (bVar6) {
                  pOVar8 = *(ON_SubDEdge **)((long)*local_78 + (ulong)(uVar15 << 4) + 8);
                  if (pOVar8 != (ON_SubDEdge *)0x0) {
                    bVar6 = ON_SubDEdge::IsCrease(pOVar8);
                    if (bVar6) {
                      lVar16 = *(long *)(&DAT_006e2558 + uVar9 * 8);
                      uVar9 = (ulong)uVar15;
                      puVar10 = &DAT_006e2578;
LAB_00625303:
                      lVar18 = *(long *)(puVar10 + uVar9 * 8);
LAB_006253e2:
                      if ((local_60[lVar16][lVar18] != (ON_SubDFace *)0x0) &&
                         (local_60[lVar16][lVar18]->m_edge_count == 4)) goto LAB_00625245;
                    }
                  }
                }
              }
              else if ((acStack_a7[uVar13 + 0xf] == '\0') || (acStack_a7[uVar9 + 0xb] != '\x01')) {
                if ((acStack_a7[uVar13 + 0xb] != '\0') && (acStack_a7[uVar9 + 0xb] == '\x01')) {
                  bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)OVar2);
                  if (!bVar6) {
                    bVar6 = ON_SubDVertex::IsCorner((ON_SubDVertex *)OVar2);
                    if (!bVar6) goto LAB_00625406;
                  }
                  bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)(&local_58)[uVar11]);
                  if (bVar6) {
                    bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)(&local_58)[uVar9]);
                    if (bVar6) {
                      bVar6 = IsOrdinarySmoothQuadCornerVertex
                                        ((ON_SubDVertex *)(&local_58)[uVar13 ^ 2]);
                      if (bVar6) {
                        pOVar8 = *(ON_SubDEdge **)((long)*local_78 + (ulong)(uVar11 << 4));
                        this_01 = local_78[uVar13 ^ 2][1];
                        if (this_01 != (ON_SubDEdge *)0x0 && pOVar8 != (ON_SubDEdge *)0x0) {
                          bVar6 = ON_SubDEdge::IsCrease(pOVar8);
                          if (bVar6) {
                            bVar7 = (int)local_80 != 0;
                            bVar6 = ON_SubDEdge::IsCrease(this_01);
                            if (bVar6 && bVar7) {
                              bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)OVar2);
                              if (bVar6) {
                                acStack_a7[uVar13 + 3] = '\0';
                                local_88 = (ON_SubDVertex *)CONCAT44(local_88._4_4_,iVar17);
                              }
                              else {
                                bVar6 = ON_SubDVertex::IsCorner((ON_SubDVertex *)OVar2);
                                iVar5 = (int)local_90;
                                if (bVar6) {
                                  iVar5 = iVar17;
                                }
                                local_90 = (ON_SubDVertex *)CONCAT44(local_90._4_4_,iVar5);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                bVar6 = ON_SubDVertex::IsCrease((ON_SubDVertex *)OVar2);
                if ((bVar6) && ((*papOVar14)[0] != (ON_SubDEdge *)0x0)) {
                  bVar6 = ON_SubDEdge::IsCrease((*papOVar14)[0]);
                  if (bVar6) {
                    if ((uint)(uVar13 - 1) < 3) {
                      uVar9 = uVar13 - 1 & 0xffffffff;
                      lVar16 = 2 - uVar9;
                      puVar10 = &DAT_006e2328;
                      goto LAB_00625303;
                    }
                    lVar16 = 1;
                    lVar18 = 0;
                    goto LAB_006253e2;
                  }
                }
              }
            }
          }
        }
      }
LAB_00625406:
      uVar13 = uVar13 + 1;
      papOVar14 = papOVar14 + 1;
    } while (uVar13 != 4);
    uVar11 = (uint)local_90;
    uVar15 = (uint)local_88;
  }
  this->m_extraordinary_corner_vertex_count = '\0';
  lVar16 = 0;
  uVar12 = '\0';
  do {
    bVar6 = (bool)acStack_a7[lVar16 + 3];
    this->m_bExtraordinaryCornerVertex[lVar16] = bVar6;
    if (bVar6 == true) {
      uVar12 = uVar12 + '\x01';
      this->m_extraordinary_corner_vertex_count = uVar12;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  this->m_exact_quadrant_patch_count = '\0';
  bVar1 = this->m_boundary_crease_count;
  lVar16 = 3;
  uVar12 = '\0';
  do {
    this->m_bExtraordinaryCornerVertex[lVar16 + 2] = false;
    if (((bVar1 < 3) &&
        (((uVar4 = (uint)lVar16, uVar15 < 4 || bVar1 != 2 ||
          ((uVar11 < 4 && ((uVar4 - 3 ^ uVar11) == 2)))) && (acStack_a7[lVar16 + 4] == '\0')))) &&
       (((acStack_a7[lVar16] == '\0' && (acStack_a7[(ulong)(uVar4 - 2 & 3) + 3] == '\0')) &&
        (acStack_a7[(ulong)(uVar4 & 3) + 3] == '\0')))) {
      this->m_bExtraordinaryCornerVertex[lVar16 + 2] = true;
      uVar12 = uVar12 + '\x01';
      this->m_exact_quadrant_patch_count = uVar12;
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 7);
  min_face_grid_dex_00.j = local_68.j;
  min_face_grid_dex_00.i = local_68.i;
  OVar2.j = local_70.j;
  OVar2.i = local_70.i;
  bVar6 = VertexGridIsExactCubicPatch(this,min_face_grid_dex_00,OVar2,uVar15);
  this->m_bIsCubicPatch = bVar6;
  return;
}

Assistant:

void ON_SubDQuadNeighborhood::SetPatchStatus(
  const unsigned int fvi0
  )
{
  m_bIsCubicPatch = false;

  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned int delta_subdivision_level 
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? ((unsigned int)(m_current_subdivision_level - m_initial_subdivision_level))
    : 0U;

  ON_2dex min_face_grid_dex = { 0, 0 };
  ON_2dex max_face_grid_dex = { 3, 3 };

  m_boundary_crease_count = 0;
  if (m_bBoundaryCrease[0])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.j++;
  }
  if (m_bBoundaryCrease[1])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.i--;
  }
  if (m_bBoundaryCrease[2])
  {
    m_boundary_crease_count++;
    max_face_grid_dex.j--;
  }
  if (m_bBoundaryCrease[3])
  {
    m_boundary_crease_count++;
    min_face_grid_dex.i++;
  }


  const unsigned int fvi1 = (fvi0+1)%4;
  const unsigned int fvi2 = (fvi0+2)%4;
  const unsigned int fvi3 = (fvi0+3)%4;

  bool bCenterEdgeIsSmooth[4] = {};
  bCenterEdgeIsSmooth[fvi0] = m_center_edges[fvi0]->IsSmoothNotX();
  bCenterEdgeIsSmooth[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsSmoothNotX() : true;
  bCenterEdgeIsSmooth[fvi3] = m_center_edges[fvi3]->IsSmoothNotX();

  bool bCenterEdgeIsCrease[4] = {};
  bCenterEdgeIsCrease[fvi0] = bCenterEdgeIsSmooth[fvi0] ? false : m_center_edges[fvi0]->IsCrease();
  bCenterEdgeIsCrease[fvi1] = (0 == delta_subdivision_level) ? m_center_edges[fvi1]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi2] = (0 == delta_subdivision_level) ? m_center_edges[fvi2]->IsCrease() : false;
  bCenterEdgeIsCrease[fvi3] = bCenterEdgeIsSmooth[fvi3] ? false : m_center_edges[fvi3]->IsCrease();

  bool bEdgeTagX = false;
  for (unsigned int i = 0; i < 4; i++)
  {
    if (
      nullptr != m_center_edges[i]
      && ON_SubDEdgeTag::SmoothX != m_center_edges[i]->m_edge_tag
      && (bCenterEdgeIsSmooth[i] != bCenterEdgeIsCrease[i])
      )
    {
      continue;
    }
    bEdgeTagX = true;
    break;
  }

  m_sharp_edge_count = 0;
  bool bSharpQuadrant[4] = {};
  for(unsigned int i = 0; i < 4; ++i)
  {
    if (nullptr != m_center_edges[i] && m_center_edges[i]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[0] = true;
      bSharpQuadrant[1] = true;
      bSharpQuadrant[2] = true;
      bSharpQuadrant[3] = true;
    }
    if (nullptr != this->m_edge_grid[i][0] && this->m_edge_grid[i][0]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
    if (nullptr != this->m_edge_grid[i][1] && this->m_edge_grid[i][1]->IsSharp())
    {
      ++m_sharp_edge_count;
      bSharpQuadrant[i % 4U] = true;
      bSharpQuadrant[(i + 1U) % 4U] = true;
      bSharpQuadrant[(i + 3U) % 4U] = true;
    }
  }

  ////////////////////////////////////////////////////////////////////////////
  //
  // Set 
  //  m_bExtraordinaryCornerVertex[], m_extraordinary_corner_vertex_count
  //  m_bExactQuadrantPatch[], and m_exact_quadrant_patch_count
  // 
  unsigned int boundary_crease_corner_index = 86U;
  unsigned int boundary_corner_corner_index = 86U;

  bool bExtraordinaryCornerVertex[4] = {};
  bExtraordinaryCornerVertex[fvi0] = true;
  bExtraordinaryCornerVertex[fvi1] = (0 == delta_subdivision_level || bEdgeTagX);
  bExtraordinaryCornerVertex[fvi2] = bExtraordinaryCornerVertex[fvi1];
  bExtraordinaryCornerVertex[fvi3] = bExtraordinaryCornerVertex[fvi1];


  const ON_SubDVertex* quad_vertex[4] = {
    m_vertex_grid[1][1],
    m_vertex_grid[2][1],
    m_vertex_grid[2][2],
    m_vertex_grid[1][2]
  };

  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    // Dale Lear 2024 Feb 28 Fix RH-80676
    // Even when bSharpQuadrant[corner_index] is true from tests above,
    // we have to call quad_vertex[corner_index]->VertexSharpness() to
    // insure all sharp edges are taken into account.
    if (quad_vertex[corner_index]->VertexSharpness() > 0.0)
    {
      bSharpQuadrant[corner_index] = true;
      bSharpQuadrant[(corner_index + 1U) % 4U] = true;
      bSharpQuadrant[(corner_index + 3U) % 4U] = true;
    }
  }

  if (false == bEdgeTagX)
  {
    const bool bQuadVertexIsSmoothOrCrease[4] =
    {
      quad_vertex[0]->IsSmoothOrCrease(),
      quad_vertex[1]->IsSmoothOrCrease(),
      quad_vertex[2]->IsSmoothOrCrease(),
      quad_vertex[3]->IsSmoothOrCrease()
    };

    for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
    {
      if (false == bExtraordinaryCornerVertex[corner_index])
        continue;

      if (quad_vertex[corner_index]->IsDart())
        continue;

      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+1)%4])
        continue;
      if (false == bQuadVertexIsSmoothOrCrease[(corner_index+3)%4])
        continue;

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (IsOrdinarySmoothQuadCornerVertex(quad_vertex[corner_index]))
          bExtraordinaryCornerVertex[corner_index] = false;
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsSmooth[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[(corner_index + 3) % 4][1];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace((corner_index + 3) % 4);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsSmooth[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (quad_vertex[corner_index]->IsCrease())
        {
          const ON_SubDEdge* e = m_edge_grid[corner_index][0];
          if (nullptr != e && e->IsCrease())
          {
            const ON_SubDFace* f = SideFace(corner_index);
            if (nullptr != f && 4 == f->m_edge_count)
              bExtraordinaryCornerVertex[corner_index] = false;
          }
        }
        continue;
      }

      if (bCenterEdgeIsCrease[corner_index] && bCenterEdgeIsCrease[(corner_index + 3) % 4])
      {
        if (
          (quad_vertex[corner_index]->IsCrease() || quad_vertex[corner_index]->IsCorner())
          && quad_vertex[(corner_index + 1) % 4]->IsCrease()
          && quad_vertex[(corner_index + 3) % 4]->IsCrease()
          && IsOrdinarySmoothQuadCornerVertex(quad_vertex[(corner_index + 2) % 4])
          )
        {
          const ON_SubDEdge* e1 = m_edge_grid[(corner_index + 1) % 4][0];
          const ON_SubDEdge* e2 = m_edge_grid[(corner_index + 2) % 4][1];
          if (nullptr != e1 && nullptr != e2 && e1->IsCrease() && e2->IsCrease())
          {
            if (delta_subdivision_level > 0)
            {
              if (quad_vertex[corner_index]->IsCrease())
              {
                boundary_crease_corner_index = corner_index;
                bExtraordinaryCornerVertex[corner_index] = false;
              }
              else if ( quad_vertex[corner_index]->IsCorner() )
              {
                boundary_corner_corner_index = corner_index;
              }
            }
          }
        }
        continue;
      }

    }
  }

  m_extraordinary_corner_vertex_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExtraordinaryCornerVertex[corner_index] = bExtraordinaryCornerVertex[corner_index];
    if (bExtraordinaryCornerVertex[corner_index])
      m_extraordinary_corner_vertex_count++;
  }

  m_exact_quadrant_patch_count = 0;
  for (unsigned int corner_index = 0; corner_index < 4; corner_index++)
  {
    m_bExactQuadrantPatch[corner_index] = false;
    if (m_boundary_crease_count > 2)
      continue;
    if (2 == m_boundary_crease_count)
    {
      if (boundary_crease_corner_index >= 4)
      {
        if ( boundary_corner_corner_index >= 4 || ((boundary_corner_corner_index+2)%4) != corner_index)
          continue;
      }
    }
    if (bSharpQuadrant[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[corner_index])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 1) % 4])
      continue;
    if (bExtraordinaryCornerVertex[(corner_index + 3) % 4])
      continue;
    m_bExactQuadrantPatch[corner_index] = true;
    m_exact_quadrant_patch_count++;
  }

  // Set m_bIsCubicPatch
  m_bIsCubicPatch = VertexGridIsExactCubicPatch(
    min_face_grid_dex,
    max_face_grid_dex,
    boundary_crease_corner_index
    );
}